

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O2

size_t __thiscall DObject::PointerSubstitution(DObject *this,DObject *old,DObject *notOld)

{
  size_t sVar1;
  PClass *this_00;
  size_t sVar2;
  size_t *psVar3;
  
  this_00 = GetClass(this);
  psVar3 = this_00->FlatPointers;
  if (psVar3 == (size_t *)0x0) {
    PClass::BuildFlatPointers(this_00);
    psVar3 = this_00->FlatPointers;
  }
  sVar2 = 0;
  for (; sVar1 = *psVar3, sVar1 != 0xffffffffffffffff; psVar3 = psVar3 + 1) {
    if (*(DObject **)((long)&this->_vptr_DObject + sVar1) == old) {
      *(DObject **)((long)&this->_vptr_DObject + sVar1) = notOld;
      sVar2 = sVar2 + 1;
    }
  }
  return sVar2;
}

Assistant:

size_t DObject::PointerSubstitution (DObject *old, DObject *notOld)
{
	const PClass *info = GetClass();
	const size_t *offsets = info->FlatPointers;
	size_t changed = 0;
	if (offsets == NULL)
	{
		const_cast<PClass *>(info)->BuildFlatPointers();
		offsets = info->FlatPointers;
	}
	while (*offsets != ~(size_t)0)
	{
		if (*(DObject **)((BYTE *)this + *offsets) == old)
		{
			*(DObject **)((BYTE *)this + *offsets) = notOld;
			changed++;
		}
		offsets++;
	}
	return changed;
}